

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

LinTerms * mp::ToLinTerms(LinearExpr *e)

{
  bool bVar1;
  const_iterator this;
  pointer pTVar2;
  LinTerms *in_RDI;
  double c;
  const_iterator it;
  LinTerms *le;
  LinearExpr *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_30 [3];
  undefined1 local_11;
  
  local_11 = 0;
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  LinearExpr::num_terms((LinearExpr *)0x3ab90f);
  LinTerms::reserve((LinTerms *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (size_t)in_stack_ffffffffffffff88);
  local_30[0].m_ptr = (Term *)LinearExpr::begin(in_stack_ffffffffffffff88);
  while( true ) {
    this = LinearExpr::end(in_stack_ffffffffffffff88);
    bVar1 = gch::operator!=((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
                            in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pTVar2 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x3ab97d);
    c = LinearExpr::Term::coef(pTVar2);
    pTVar2 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x3ab997);
    in_stack_ffffffffffffff94 = LinearExpr::Term::var_index(pTVar2);
    LinTerms::add_term((LinTerms *)this.m_ptr,c,in_stack_ffffffffffffff94);
    gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(local_30);
  }
  return in_RDI;
}

Assistant:

inline
LinTerms ToLinTerms(const LinearExpr& e) {
  LinTerms le;
  le.reserve(e.num_terms());
  for (auto it=e.begin(); it!=e.end(); ++it) {
    le.add_term(it->coef(), it->var_index());
  }
  return le;
}